

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

void mpack_write_bin(mpack_writer_t *writer,char *data,uint32_t count)

{
  mpack_start_bin(writer,count);
  mpack_write_native(writer,data,(ulong)count);
  return;
}

Assistant:

void mpack_write_bin(mpack_writer_t* writer, const char* data, uint32_t count) {
    mpack_assert(data != NULL, "data pointer for bin of %i bytes is NULL", (int)count);
    mpack_start_bin(writer, count);
    mpack_write_bytes(writer, data, count);
    mpack_finish_bin(writer);
}